

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

string * __thiscall FastPForLib::FastPFor<8u>::name_abi_cxx11_(FastPFor<8U> *this)

{
  string *in_RDI;
  string local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
             (allocator<char> *)in_stack_ffffffffffffffb0);
  std::__cxx11::to_string(in_stack_ffffffffffffffcc);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  return in_RDI;
}

Assistant:

std::string name() const override {
    return std::string("FastPFor") + std::to_string(BlockSize);
  }